

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

err_t TextWrite(textwriter *p,tchar_t *Msg)

{
  size_t sVar1;
  err_t eVar2;
  char local_428 [8];
  char s [1024];
  size_t i;
  tchar_t *Msg_local;
  textwriter *p_local;
  
  CharConvSS(p->CC,local_428,0x400,Msg);
  sVar1 = strlen(local_428);
  if (p->Stream != (stream *)0x0) {
    eVar2 = (**(code **)((long)(p->Stream->Base).VMT + 0x70))(p->Stream,local_428,sVar1,0);
    return eVar2;
  }
  __assert_fail("(const void*)(p->Stream)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                ,0x124,"err_t TextWrite(textwriter *, const tchar_t *)");
}

Assistant:

err_t TextWrite(textwriter* p, const tchar_t* Msg)
{
    size_t i;
    char s[MAXLINE];
    CharConvST(p->CC,s,sizeof(s),Msg);

    i = strlen(s);

#if defined(TARGET_WIN)
    {
        char* nl = s;
        while (i+1<sizeof(s) && (nl = strchr(nl,10))!=NULL)
        {
            memmove(nl+1,nl,i+1-(nl-s));
            *nl = 13;
            nl += 2;
            ++i;
        }
    }
#endif

    return Stream_Write(p->Stream,s,i,NULL);
}